

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O2

void __thiscall sf2cute::RIFFChunk::RIFFChunk(RIFFChunk *this,string *name)

{
  string local_40;
  
  (this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface = (_func_int **)&PTR__RIFFChunk_0011d9c0
  ;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  set_name(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

RIFFChunk::RIFFChunk(std::string name) {
  set_name(std::move(name));
}